

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

bam_pileup1_t * bam_plp_next(bam_plp_t iter,int *_tid,int *_pos,int *_n_plp)

{
  int *piVar1;
  uint *puVar2;
  ushort uVar3;
  mempool_t *pmVar4;
  ulong uVar5;
  uint8_t *puVar6;
  ulong uVar7;
  lbnode_t **pplVar8;
  bam_pileup1_t *__ptr;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  lbnode_t *plVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  lbnode_t *b;
  int iVar22;
  bool bVar23;
  
  if (iter->error == 0) {
    *_n_plp = 0;
    iVar21 = iter->is_eof;
    if ((iVar21 == 0) || (iter->head->next != (__linkbuf_t *)0x0)) {
      do {
        if ((iVar21 == 0) && (iter->max_tid <= iter->tid)) {
          if (iter->max_tid != iter->tid) {
            return (bam_pileup1_t *)0x0;
          }
          if (iter->max_pos <= iter->pos) {
            return (bam_pileup1_t *)0x0;
          }
        }
        b = iter->head;
        plVar15 = iter->dummy;
        plVar15->next = b;
        if (b->next == (__linkbuf_t *)0x0) {
          bVar23 = false;
          iVar21 = 0;
        }
        else {
          iVar21 = 0;
          do {
            iVar9 = (b->b).core.tid;
            if (iVar9 < iter->tid) {
LAB_001174e0:
              overlap_remove((bam_plp_t)iter->overlaps,&b->b);
              plVar15->next = b->next;
              pmVar4 = iter->mp;
              pmVar4->cnt = pmVar4->cnt + -1;
              b->next = (__linkbuf_t *)0x0;
              iVar9 = pmVar4->n;
              if (iVar9 == pmVar4->max) {
                iVar11 = iVar9 * 2;
                if (iVar9 == 0) {
                  iVar11 = 0x100;
                }
                pmVar4->max = iVar11;
                pplVar8 = (lbnode_t **)realloc(pmVar4->buf,(long)iVar11 << 3);
                pmVar4->buf = pplVar8;
                iVar9 = pmVar4->n;
              }
              else {
                pplVar8 = pmVar4->buf;
              }
              pmVar4->n = iVar9 + 1;
              pplVar8[iVar9] = b;
              b = plVar15;
            }
            else if (iVar9 == iter->tid) {
              iVar9 = iter->pos;
              if (b->end <= iVar9) goto LAB_001174e0;
              if (b->beg <= iVar9) {
                __ptr = iter->plp;
                if (iVar21 == iter->max_plp) {
                  iVar9 = iVar21 * 2;
                  if (iVar21 == 0) {
                    iVar9 = 0x100;
                  }
                  iter->max_plp = iVar9;
                  __ptr = (bam_pileup1_t *)realloc(__ptr,(long)iVar9 * 0x18);
                  iter->plp = __ptr;
                  iVar9 = iter->pos;
                }
                __ptr[iVar21].b = &b->b;
                uVar5 = *(ulong *)&(b->b).core.field_0x8;
                puVar6 = (b->b).data;
                uVar16 = uVar5 >> 0x18 & 0xff;
                puVar2 = (uint *)(puVar6 + uVar16);
                uVar12 = (b->s).k;
                lVar18 = (long)(int)uVar12;
                uVar3 = (ushort)(uVar5 >> 0x30);
                if (lVar18 == -1) {
                  if ((uVar5 & 0xffff000000000000) == 0x1000000000000) {
                    uVar12 = 0xffffffff;
                    if (((*puVar2 & 0xf) < 9) && ((0x181U >> (*puVar2 & 0xf) & 1) != 0)) {
                      uVar12 = 0;
                      (b->s).k = 0;
                      (b->s).x = (b->b).core.pos;
                      (b->s).y = 0;
                    }
                  }
                  else {
                    iVar11 = (b->b).core.pos;
                    (b->s).x = iVar11;
                    (b->s).y = 0;
                    uVar19 = 0;
                    if (0xffffffffffff < uVar5) {
                      uVar12 = *puVar2;
                      uVar20 = uVar12 & 0xf;
                      if (1 < uVar20 - 7 && (uVar12 & 0xd) != 0) {
                        iVar22 = 0;
                        uVar7 = 1;
                        do {
                          uVar19 = uVar7;
                          if ((uVar20 == 1) || (uVar20 == 4)) {
                            iVar22 = iVar22 + (uVar12 >> 4);
                            (b->s).y = iVar22;
                          }
                          else if (uVar20 == 3) {
                            iVar11 = iVar11 + (uVar12 >> 4);
                            (b->s).x = iVar11;
                          }
                          if ((uVar5 >> 0x30 <= uVar19) ||
                             (uVar12 = puVar2[uVar19], (uVar12 & 0xd) == 0)) break;
                          uVar20 = uVar12 & 0xf;
                          uVar7 = uVar19 + 1;
                        } while (1 < uVar20 - 7);
                      }
                    }
                    uVar12 = (uint)uVar19;
                    if (uVar3 <= uVar12) {
                      __assert_fail("k < c->n_cigar",
                                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/sam.c"
                                    ,0x550,
                                    "int resolve_cigar2(bam_pileup1_t *, int32_t, cstate_t *)");
                    }
                    (b->s).k = uVar12;
                  }
                }
                else {
                  uVar20 = puVar2[lVar18] >> 4;
                  iVar11 = (b->s).x;
                  if ((int)uVar20 <= iVar9 - iVar11) {
                    uVar14 = (uint)uVar3;
                    if ((int)uVar14 <= (int)uVar12) {
                      __assert_fail("s->k < c->n_cigar",
                                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/sam.c"
                                    ,0x556,
                                    "int resolve_cigar2(bam_pileup1_t *, int32_t, cstate_t *)");
                    }
                    uVar17 = puVar2[lVar18 + 1];
                    uVar10 = puVar2[lVar18] & 0xf;
                    if ((((uVar17 & 0xf) == 8) || ((uVar17 & 0xd) == 0)) || ((uVar17 & 0xb) == 3)) {
                      if ((uVar10 < 9) && ((0x181U >> uVar10 & 1) != 0)) {
                        piVar1 = &(b->s).y;
                        *piVar1 = *piVar1 + uVar20;
                      }
                      (b->s).x = iVar11 + uVar20;
                      uVar19 = (ulong)(uVar12 + 1);
                    }
                    else {
                      if ((uVar10 < 9) && ((0x181U >> uVar10 & 1) != 0)) {
                        piVar1 = &(b->s).y;
                        *piVar1 = *piVar1 + uVar20;
                      }
                      (b->s).x = iVar11 + uVar20;
                      uVar19 = lVar18 + 1;
                      if ((int)uVar19 < (int)uVar14) {
                        do {
                          uVar12 = puVar2[uVar19];
                          uVar20 = uVar12 & 0xf;
                          if (((uVar20 == 8) || ((uVar12 & 0xd) == 0)) || ((uVar12 & 0xb) == 3))
                          break;
                          if ((uVar20 == 4) || (uVar20 == 1)) {
                            piVar1 = &(b->s).y;
                            *piVar1 = *piVar1 + (uVar12 >> 4);
                          }
                          uVar19 = uVar19 + 1;
                        } while ((long)uVar19 < (long)(uVar5 >> 0x30));
                      }
                    }
                    uVar12 = (uint)uVar19;
                    (b->s).k = uVar12;
                    if ((int)uVar14 <= (int)uVar12) {
                      __assert_fail("s->k < c->n_cigar",
                                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/sam.c"
                                    ,0x566,
                                    "int resolve_cigar2(bam_pileup1_t *, int32_t, cstate_t *)");
                    }
                  }
                }
                uVar12 = puVar2[(int)uVar12];
                uVar20 = *(uint *)&__ptr[iVar21].field_0x14;
                __ptr[iVar21].indel = 0;
                uVar20 = uVar20 & 0xfffffff6;
                *(uint *)&__ptr[iVar21].field_0x14 = uVar20;
                iVar11 = (b->s).x;
                if ((uVar12 >> 4) + iVar11 + -1 == iVar9) {
                  iVar22 = (b->s).k;
                  uVar3 = *(ushort *)&(b->b).core.field_0xe;
                  if (iVar22 + 1 < (int)(uint)uVar3) {
                    uVar14 = puVar2[(long)iVar22 + 1] & 0xf;
                    uVar17 = puVar2[(long)iVar22 + 1] >> 4;
                    if (uVar14 == 1) {
LAB_001178f4:
                      __ptr[iVar21].indel = uVar17;
                    }
                    else if (uVar14 == 6) {
                      lVar18 = (long)iVar22 + 2;
                      if ((int)lVar18 < (int)(uint)uVar3) {
                        lVar13 = 0;
                        uVar17 = 0;
                        do {
                          uVar14 = *(uint *)(puVar6 + lVar13 * 4 + uVar16 + lVar18 * 4);
                          if ((uVar14 & 0xf) == 1) {
                            uVar17 = uVar17 + (uVar14 >> 4);
                          }
                          else if ((((uVar14 & 0xf) == 8) || ((uVar14 & 0xd) == 0)) ||
                                  ((uVar14 & 0xb) == 3)) break;
                          lVar13 = lVar13 + 1;
                        } while (((uint)uVar3 - iVar22) + -2 != (int)lVar13);
                        if (0 < (int)uVar17) goto LAB_001178f4;
                      }
                    }
                    else if (uVar14 == 2) {
                      uVar17 = -uVar17;
                      goto LAB_001178f4;
                    }
                  }
                }
                if ((uVar12 & 7) == 0 || (uVar12 & 0xf) == 7) {
                  __ptr[iVar21].qpos = (iVar9 - iVar11) + (b->s).y;
                }
                else if ((uVar12 & 0xe) == 2) {
                  *(uint *)&__ptr[iVar21].field_0x14 = uVar20 | 1;
                  __ptr[iVar21].qpos = (b->s).y;
                  uVar20 = uVar20 + (uint)((uVar12 & 0xf) == 3) * 8 + 1;
                  *(uint *)&__ptr[iVar21].field_0x14 = uVar20;
                }
                uVar12 = (uVar20 & 0xfffffffd) + (uint)((b->b).core.pos == iVar9) * 2;
                *(uint *)&__ptr[iVar21].field_0x14 = uVar12;
                *(uint *)&__ptr[iVar21].field_0x14 =
                     (uVar12 & 0xfffffffb) + (uint)((b->s).end == iVar9) * 4;
                iVar21 = iVar21 + 1;
              }
            }
            plVar15 = b;
            b = plVar15->next;
          } while (b->next != (__linkbuf_t *)0x0);
          b = iter->dummy->next;
          bVar23 = b->next != (__linkbuf_t *)0x0;
        }
        iter->head = b;
        *_n_plp = iVar21;
        *_tid = iter->tid;
        iVar9 = iter->pos;
        *_pos = iVar9;
        iVar11 = (b->b).core.tid;
        if ((bool)(iVar11 < iter->tid & bVar23)) {
          fprintf(_stderr,"[%s] unsorted input. Pileup aborts.\n","bam_plp_next");
          iter->error = 1;
          *_n_plp = -1;
          return (bam_pileup1_t *)0x0;
        }
        if (iter->tid < iVar11) {
          iter->tid = iVar11;
          iVar11 = b->beg;
        }
        else {
          iVar11 = iVar9 + 1;
          if (iVar9 < b->beg) {
            iVar11 = b->beg;
          }
        }
        iter->pos = iVar11;
        if (iVar21 != 0) {
          return iter->plp;
        }
        iVar21 = iter->is_eof;
      } while (bVar23 || iVar21 == 0);
    }
  }
  else {
    *_n_plp = -1;
  }
  return (bam_pileup1_t *)0x0;
}

Assistant:

const bam_pileup1_t *bam_plp_next(bam_plp_t iter, int *_tid, int *_pos, int *_n_plp)
{
    if (iter->error) { *_n_plp = -1; return 0; }
    *_n_plp = 0;
    if (iter->is_eof && iter->head->next == 0) return 0;
    while (iter->is_eof || iter->max_tid > iter->tid || (iter->max_tid == iter->tid && iter->max_pos > iter->pos)) {
        int n_plp = 0;
        lbnode_t *p, *q;
        // write iter->plp at iter->pos
        iter->dummy->next = iter->head;
        for (p = iter->head, q = iter->dummy; p->next; q = p, p = p->next) {
            if (p->b.core.tid < iter->tid || (p->b.core.tid == iter->tid && p->end <= iter->pos)) { // then remove
                overlap_remove(iter, &p->b);
                q->next = p->next; mp_free(iter->mp, p); p = q;
            } else if (p->b.core.tid == iter->tid && p->beg <= iter->pos) { // here: p->end > pos; then add to pileup
                if (n_plp == iter->max_plp) { // then double the capacity
                    iter->max_plp = iter->max_plp? iter->max_plp<<1 : 256;
                    iter->plp = (bam_pileup1_t*)realloc(iter->plp, sizeof(bam_pileup1_t) * iter->max_plp);
                }
                iter->plp[n_plp].b = &p->b;
                if (resolve_cigar2(iter->plp + n_plp, iter->pos, &p->s)) ++n_plp; // actually always true...
            }
        }
        iter->head = iter->dummy->next; // dummy->next may be changed
        *_n_plp = n_plp; *_tid = iter->tid; *_pos = iter->pos;
        // update iter->tid and iter->pos
        if (iter->head->next) {
            if (iter->tid > iter->head->b.core.tid) {
                fprintf(stderr, "[%s] unsorted input. Pileup aborts.\n", __func__);
                iter->error = 1;
                *_n_plp = -1;
                return 0;
            }
        }
        if (iter->tid < iter->head->b.core.tid) { // come to a new reference sequence
            iter->tid = iter->head->b.core.tid; iter->pos = iter->head->beg; // jump to the next reference
        } else if (iter->pos < iter->head->beg) { // here: tid == head->b.core.tid
            iter->pos = iter->head->beg; // jump to the next position
        } else ++iter->pos; // scan contiguously
        // return
        if (n_plp) return iter->plp;
        if (iter->is_eof && iter->head->next == 0) break;
    }
    return 0;
}